

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
IndexTools::JointToIndividualIndices
          (LIndex jointI,vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems)

{
  ulong uVar1;
  size_type sVar2;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this;
  LIndex *pLVar3;
  reference pvVar4;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RDX;
  ulong in_RSI;
  allocator_type *in_RDI;
  LIndex aI;
  Index i;
  LIndex remainder;
  Index vec_size;
  LIndex *step_size;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *result;
  allocator_type *this_00;
  uint local_44;
  ulong local_40;
  
  this_00 = in_RDI;
  sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(in_RDX);
  this = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)(sVar2 & 0xffffffff);
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0xb0cc8a);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (this,(size_type)this_00,in_RDI);
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0xb0ccaa);
  if ((uint)sVar2 != 0) {
    pLVar3 = CalculateStepSize((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                               in_RDI);
    local_40 = in_RSI;
    for (local_44 = 0; local_44 < (uint)sVar2; local_44 = local_44 + 1) {
      uVar1 = pLVar3[local_44];
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this_00
                          ,(ulong)local_44);
      *pvVar4 = local_40 / uVar1;
      local_40 = local_40 % pLVar3[local_44];
    }
    if (pLVar3 != (LIndex *)0x0) {
      operator_delete__(pLVar3);
    }
  }
  return (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)in_RDI;
}

Assistant:

vector<LIndex> IndexTools::JointToIndividualIndices(LIndex jointI,
       const vector<LIndex>& nrElems) 
{
    LIndex* step_size=0;
    Index vec_size = nrElems.size();
    vector<LIndex> result(vec_size);    
    if(vec_size > 0)
    {
        step_size=CalculateStepSize(nrElems);
        LIndex remainder = jointI;
        for(Index i=0; i < vec_size ; i++)
        {
            LIndex aI = remainder / step_size[i];
            result[i]= aI;//store this indiv. index
            remainder = remainder %  step_size[i];
        }
        delete [] step_size;
    }
    return(result);
}